

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error doCdataSection(XML_Parser parser,ENCODING *enc,char **startPtr,char *end,char **nextPtr)

{
  char *extraout_RDX;
  char **ppcVar1;
  _func_int_ENCODING_ptr_char_ptr *local_68;
  ICHAR *dataPtr;
  XML_Char c;
  char **ppcStack_58;
  int tok;
  char *next;
  char **eventEndPP;
  char **eventPP;
  char *s;
  char **nextPtr_local;
  char *end_local;
  char **startPtr_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  eventPP = (char **)*startPtr;
  if (enc == *(ENCODING **)((long)parser + 0x118)) {
    eventEndPP = (char **)((long)parser + 0x218);
    *eventEndPP = (char *)eventPP;
    next = (char *)((long)parser + 0x220);
  }
  else {
    eventEndPP = *(char ***)((long)parser + 0x230);
    next = (char *)(*(long *)((long)parser + 0x230) + 8);
  }
  *eventEndPP = (char *)eventPP;
  *startPtr = (char *)0x0;
  s = (char *)nextPtr;
  nextPtr_local = (char **)end;
  end_local = (char *)startPtr;
  startPtr_local = (char **)enc;
  enc_local = (ENCODING *)parser;
  do {
    ppcVar1 = eventPP;
    dataPtr._4_4_ =
         (*(code *)startPtr_local[2])(startPtr_local,eventPP,nextPtr_local,&stack0xffffffffffffffa8)
    ;
    *(char ***)next = ppcStack_58;
    switch(dataPtr._4_4_) {
    case 0:
      *eventEndPP = (char *)ppcStack_58;
      return XML_ERROR_INVALID_TOKEN;
    case 6:
      if (enc_local->utf8Convert ==
          (_func_void_ENCODING_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr_char_ptr *)0x0) {
        if (enc_local[1].scanners[2] != (_func_int_ENCODING_ptr_char_ptr_char_ptr_char_ptr_ptr *)0x0
           ) {
          reportDefault(enc_local,(ENCODING *)startPtr_local,(char *)eventPP,(char *)ppcStack_58);
        }
      }
      else if (*(char *)((long)startPtr_local + 0x8c) == '\0') {
        while( true ) {
          local_68 = enc_local->charRefNumber;
          nextPtr = (char **)enc_local->predefinedEntityName;
          (*(code *)startPtr_local[0xf])(startPtr_local,&eventPP,ppcStack_58,&local_68);
          *(char ***)next = ppcStack_58;
          (*enc_local->utf8Convert)
                    ((ENCODING *)enc_local->scanners[1],(char **)enc_local->charRefNumber,
                     (char *)((ulong)(local_68 + -(long)enc_local->charRefNumber) & 0xffffffff),
                     (char **)(local_68 + -(long)enc_local->charRefNumber),(char *)nextPtr);
          if (eventPP == ppcStack_58) break;
          *eventEndPP = (char *)eventPP;
        }
      }
      else {
        (*enc_local->utf8Convert)
                  ((ENCODING *)enc_local->scanners[1],eventPP,
                   (char *)((ulong)((long)ppcStack_58 - (long)eventPP) & 0xffffffff),
                   (char **)((long)ppcStack_58 - (long)eventPP),(char *)nextPtr);
      }
      break;
    case 7:
      if (enc_local->utf8Convert ==
          (_func_void_ENCODING_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr_char_ptr *)0x0) {
        if (enc_local[1].scanners[2] != (_func_int_ENCODING_ptr_char_ptr_char_ptr_char_ptr_ptr *)0x0
           ) {
          reportDefault(enc_local,(ENCODING *)startPtr_local,(char *)eventPP,(char *)ppcStack_58);
        }
      }
      else {
        dataPtr._3_1_ = 10;
        (*enc_local->utf8Convert)
                  ((ENCODING *)enc_local->scanners[1],(char **)((long)&dataPtr + 3),(char *)0x1,
                   (char **)enc_local,(char *)nextPtr);
      }
      break;
    case 0x28:
      if (enc_local[1].scanners[1] == (_func_int_ENCODING_ptr_char_ptr_char_ptr_char_ptr_ptr *)0x0)
      {
        if (enc_local[1].scanners[2] != (_func_int_ENCODING_ptr_char_ptr_char_ptr_char_ptr_ptr *)0x0
           ) {
          reportDefault(enc_local,(ENCODING *)startPtr_local,(char *)eventPP,(char *)ppcStack_58);
        }
      }
      else {
        (*enc_local[1].scanners[1])
                  ((ENCODING *)enc_local->scanners[1],(char *)ppcVar1,extraout_RDX,
                   (char **)enc_local);
      }
      *(char ***)end_local = ppcStack_58;
      return XML_ERROR_NONE;
    case 0xfffffffc:
    case 0xffffffff:
      if (s == (char *)0x0) {
        parser_local._4_4_ = XML_ERROR_UNCLOSED_CDATA_SECTION;
      }
      else {
        *(char ***)s = eventPP;
        parser_local._4_4_ = XML_ERROR_NONE;
      }
      return parser_local._4_4_;
    default:
      *eventEndPP = (char *)ppcStack_58;
      return XML_ERROR_UNEXPECTED_STATE;
    case 0xfffffffe:
      if (s != (char *)0x0) {
        *(char ***)s = eventPP;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    }
    eventPP = ppcStack_58;
    *eventEndPP = (char *)ppcStack_58;
  } while( true );
}

Assistant:

static
enum XML_Error doCdataSection(XML_Parser parser,
                              const ENCODING *enc,
                              const char **startPtr,
                              const char *end,
                              const char **nextPtr)
{
  const char *s = *startPtr;
  const char **eventPP;
  const char **eventEndPP;
  if (enc == encoding) {
    eventPP = &eventPtr;
    *eventPP = s;
    eventEndPP = &eventEndPtr;
  }
  else {
    eventPP = &(openInternalEntities->internalEventPtr);
    eventEndPP = &(openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;
  *startPtr = 0;
  for (;;) {
    const char *next;
    int tok = XmlCdataSectionTok(enc, s, end, &next);
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_CDATA_SECT_CLOSE:
      if (endCdataSectionHandler)
        endCdataSectionHandler(handlerArg);
#if 0
      /* see comment under XML_TOK_CDATA_SECT_OPEN */
      else if (characterDataHandler)
        characterDataHandler(handlerArg, dataBuf, 0);
#endif
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      *startPtr = next;
      return XML_ERROR_NONE;
    case XML_TOK_DATA_NEWLINE:
      if (characterDataHandler) {
        XML_Char c = 0xA;
        characterDataHandler(handlerArg, &c, 1);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_DATA_CHARS:
      if (characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          for (;;) {
            ICHAR *dataPtr = (ICHAR *)dataBuf;
            XmlConvert(enc, &s, next, &dataPtr, (ICHAR *)dataBufEnd);
            *eventEndPP = next;
            characterDataHandler(handlerArg, dataBuf, dataPtr - (ICHAR *)dataBuf);
            if (s == next)
              break;
            *eventPP = s;
          }
        }
        else
          characterDataHandler(handlerArg,
                               (XML_Char *)s,
                               (XML_Char *)next - (XML_Char *)s);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_PARTIAL:
    case XML_TOK_NONE:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_CDATA_SECTION;
    default:
      *eventPP = next;
      return XML_ERROR_UNEXPECTED_STATE;
    }
    *eventPP = s = next;
  }
  /* not reached */
}